

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

string * __thiscall
spvtools::opt::SENode::AsString_abi_cxx11_(string *__return_storage_ptr__,SENode *this)

{
  int iVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  iVar1 = (**this->_vptr_SENode)(this);
  switch(iVar1) {
  case 0:
    __s = "Constant";
    __a = &local_9;
    break;
  case 1:
    __s = "RecurrentAddExpr";
    __a = &local_a;
    break;
  case 2:
    __s = "Add";
    __a = &local_b;
    break;
  case 3:
    __s = "Multiply";
    __a = &local_d;
    break;
  case 4:
    __s = "Negative";
    __a = &local_c;
    break;
  case 5:
    __s = "Value Unknown";
    __a = &local_e;
    break;
  case 6:
    __s = "Can not compute";
    __a = &local_f;
    break;
  default:
    __s = "NULL";
    __a = &local_10;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string SENode::AsString() const {
  switch (GetType()) {
    case Constant:
      return "Constant";
    case RecurrentAddExpr:
      return "RecurrentAddExpr";
    case Add:
      return "Add";
    case Negative:
      return "Negative";
    case Multiply:
      return "Multiply";
    case ValueUnknown:
      return "Value Unknown";
    case CanNotCompute:
      return "Can not compute";
  }
  return "NULL";
}